

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__filename;
  int iVar1;
  powerpc_test_cpu *this;
  FILE *__stream;
  uint uVar2;
  bool bVar3;
  
  this = (powerpc_test_cpu *)operator_new(0x248);
  bVar3 = false;
  memset(this,0,0x193);
  (this->super_powerpc_cpu_base).super_PowerCore.memoryBases[0] = (void *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.memoryBases[1] = (void *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.memoryBases[2] = (void *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.memoryBases[3] = (void *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.syscall = (_func_uint32_t_PowerCore_ptr *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.handleInterrupt = (_func_void_PowerCore_ptr *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.debugger = (_func_void_PowerCore_ptr *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.getNextBreakpoint = (_func_uint32_t_uint32_t *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.blocks._M_h._M_buckets =
       &(this->super_powerpc_cpu_base).super_PowerCore.blocks._M_h._M_single_bucket;
  (this->super_powerpc_cpu_base).super_PowerCore.blocks._M_h._M_bucket_count = 1;
  (this->super_powerpc_cpu_base).super_PowerCore.blocks._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_powerpc_cpu_base).super_PowerCore.blocks._M_h._M_element_count = 0;
  (this->super_powerpc_cpu_base).super_PowerCore.blocks._M_h._M_rehash_policy._M_max_load_factor =
       1.0;
  (this->super_powerpc_cpu_base).super_PowerCore.blocks._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_powerpc_cpu_base).super_PowerCore.blocks._M_h._M_single_bucket = (__node_base_ptr)0x0
  ;
  this->results_file = (FILE *)0x0;
  (this->xer_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->xer_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->xer_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < argc) {
    iVar1 = strcmp(argv[1],"--jit");
    bVar3 = true;
    if (iVar1 == 0) {
      argv[1] = *argv;
      argv = argv + 1;
      bVar3 = argc != 2;
    }
  }
  if (bVar3) {
    __filename = argv[1];
    __stream = fopen(__filename,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"ERROR: can\'t open %s for reading\n",__filename);
    }
    else {
      this->results_file = (FILE *)__stream;
      setvbuf(__stream,main::buffer,0,0x1000);
    }
    if (__stream == (FILE *)0x0) {
      return (uint)(__stream == (FILE *)0x0);
    }
  }
  else {
    __stream = (FILE *)0x0;
  }
  if (__stream == (FILE *)0x0) {
    main_cold_1();
    uVar2 = 1;
  }
  else {
    bVar3 = powerpc_test_cpu::test(this);
    fclose(__stream);
    powerpc_test_cpu::~powerpc_test_cpu(this);
    operator_delete(this,0x248);
    uVar2 = (uint)!bVar3;
  }
  return uVar2;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef EMU_KHEPERIX
	// Initialize VM system (predecode cache uses vm_acquire())
	vm_init();
#endif

	FILE *fp = NULL;
	powerpc_test_cpu *ppc = new powerpc_test_cpu;

	if (argc > 1) {
		const char *arg = argv[1];
		if (strcmp(arg, "--jit") == 0) {
			--argc;
			argv[1] = argv[0];
			++argv;
			ppc->enable_jit();
		}
	}

	if (argc > 1) {
		const char *file = argv[1];
#ifdef NATIVE_POWERPC
		if ((fp = fopen(file, "wb")) == NULL) {
			fprintf(stderr, "ERROR: can't open %s for writing\n", file);
			return EXIT_FAILURE;
		}
#else
		if ((fp = fopen(file, "rb")) == NULL) {
			fprintf(stderr, "ERROR: can't open %s for reading\n", file);
			return EXIT_FAILURE;
		}
#endif
		ppc->set_results_file(fp);

		// Use a large enough buffer
		static char buffer[4096];
		setvbuf(fp, buffer, _IOFBF, sizeof(buffer));
	}

	// We need a results file on non PowerPC platforms
#ifndef NATIVE_POWERPC
	if (fp == NULL) {
		fprintf(stderr, "ERROR: a results file for reference is required\n");
		return EXIT_FAILURE;
	}
#endif

	// Check if host CPU supports AltiVec instructions
	has_altivec = true;
#ifdef NATIVE_POWERPC
	signal(SIGILL, sigill_handler);
	if (!sigsetjmp(env, 1))
		asm volatile(".long 0x10000484"); // vor v0,v0,v0
	signal(SIGILL, SIG_DFL);
#endif

	bool ok = ppc->test();
	if (fp) fclose(fp);
	delete ppc;
	return !ok;
}